

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_new_token_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *end;
  st_quicly_save_resumption_token_t *psVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  uint8_t *puVar5;
  ptls_iovec_t pVar6;
  
  end = state->end;
  uVar4 = ptls_decode_quicint(&state->src,end);
  puVar5 = (uint8_t *)(uVar4 + 1);
  iVar3 = 0x20007;
  if ((puVar5 < (uint8_t *)0x2) || (puVar5 = state->src, (ulong)((long)end - (long)puVar5) < uVar4))
  {
    bVar2 = false;
  }
  else {
    state->src = puVar5 + uVar4;
    bVar2 = true;
    iVar3 = 0;
  }
  if (bVar2) {
    psVar1 = ((conn->super).ctx)->save_resumption_token;
    if (psVar1 != (st_quicly_save_resumption_token_t *)0x0) {
      pVar6.len = uVar4;
      pVar6.base = puVar5;
      iVar3 = (*psVar1->cb)(psVar1,conn,pVar6);
      return iVar3;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int handle_new_token_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_new_token_frame_t frame;
    int ret;

    if ((ret = quicly_decode_new_token_frame(&state->src, state->end, &frame)) != 0)
        return ret;
    QUICLY_PROBE(NEW_TOKEN_RECEIVE, conn, conn->stash.now, frame.token.base, frame.token.len);
    if (conn->super.ctx->save_resumption_token == NULL)
        return 0;
    return conn->super.ctx->save_resumption_token->cb(conn->super.ctx->save_resumption_token, conn, frame.token);
}